

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DDLNode.cpp
# Opt level: O1

void __thiscall
ODDLParser::DDLNode::DDLNode(DDLNode *this,string *type,string *name,size_t idx,DDLNode *parent)

{
  pointer pcVar1;
  DDLNode *local_38;
  
  (this->m_type)._M_dataplus._M_p = (pointer)&(this->m_type).field_2;
  pcVar1 = (type->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + type->_M_string_length);
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar1,pcVar1 + name->_M_string_length);
  this->m_parent = parent;
  (this->m_children).
  super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_children).
  super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_children).
  super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_properties = (Property *)0x0;
  this->m_value = (Value *)0x0;
  this->m_dtArrayList = (DataArrayList *)0x0;
  this->m_references = (Reference *)0x0;
  this->m_idx = idx;
  if (parent != (DDLNode *)0x0) {
    local_38 = this;
    std::vector<ODDLParser::DDLNode*,std::allocator<ODDLParser::DDLNode*>>::
    emplace_back<ODDLParser::DDLNode*>
              ((vector<ODDLParser::DDLNode*,std::allocator<ODDLParser::DDLNode*>> *)
               &parent->m_children,&local_38);
  }
  return;
}

Assistant:

DDLNode::DDLNode( const std::string &type, const std::string &name, size_t idx, DDLNode *parent )
: m_type( type )
, m_name( name )
, m_parent( parent )
, m_children()
, m_properties( ddl_nullptr )
, m_value( ddl_nullptr )
, m_dtArrayList( ddl_nullptr )
, m_references( ddl_nullptr )
, m_idx( idx ) {
    if( m_parent ) {
        m_parent->m_children.push_back( this );
    }
}